

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::_::
CopyConstructArray_<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  unsigned_long uVar1;
  RawBrandedSchema *pRVar2;
  unsigned_long uVar3;
  RawBrandedSchema *pRVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  Entry *pEVar7;
  
  pEVar5 = this->start;
  pEVar7 = this->pos;
  if (pEVar5 < pEVar7) {
    do {
      pEVar6 = (Entry *)&pEVar7[-3].value;
      this->pos = pEVar6;
      uVar1 = pEVar7[-2].key;
      if (uVar1 != 0) {
        pRVar2 = pEVar7[-2].value.super_Schema.raw;
        uVar3 = pEVar7[-1].key;
        pEVar7[-2].key = 0;
        pEVar7[-2].value.super_Schema.raw = (RawBrandedSchema *)0x0;
        pEVar7[-1].key = 0;
        pRVar4 = pEVar7[-1].value.super_Schema.raw;
        (*(code *)pRVar4->generic->id)
                  (pRVar4,uVar1,8,(long)((long)pRVar2 - uVar1) >> 3,(long)(uVar3 - uVar1) >> 3,0);
        pEVar5 = this->start;
        pEVar6 = this->pos;
      }
      pEVar7 = pEVar6;
    } while (pEVar5 < pEVar6);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }